

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionContext::GetTxInIndex
          (ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  OutPoint *in_RSI;
  long *in_RDI;
  Txid local_30;
  OutPoint *local_10;
  
  local_10 = in_RSI;
  core::OutPoint::GetTxid(&local_30,in_RSI);
  uVar1 = core::OutPoint::GetVout(local_10);
  uVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,&local_30,uVar1);
  core::Txid::~Txid((Txid *)0x54f04e);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransactionContext::GetTxInIndex(
    const OutPoint& outpoint) const {
  return GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}